

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::DetectMapConflicts
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  long lVar1;
  long lVar2;
  string *psVar3;
  long *plVar4;
  Type *proto_00;
  iterator iVar5;
  size_type *psVar6;
  long lVar7;
  long lVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_bool>
  pVar10;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
  seen_types;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>
  local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  DescriptorProto *local_80;
  DescriptorBuilder *local_78;
  Descriptor *local_70;
  RepeatedPtrFieldBase *local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80 = proto;
  local_78 = this;
  local_70 = message;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < *(int *)(message + 0x48)) {
    local_68 = &(proto->nested_type_).super_RepeatedPtrFieldBase;
    lVar8 = 0;
    lVar7 = 0;
    do {
      local_c8.first._M_dataplus._M_p = (pointer)&local_c8.first.field_2;
      lVar1 = *(long *)(message + 0x50);
      lVar2 = **(long **)(lVar1 + lVar8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,lVar2,(*(long **)(lVar1 + lVar8))[1] + lVar2);
      local_c8.second = (Descriptor *)(lVar8 + lVar1);
      pVar10 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::Descriptor_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor_const*>>>
               ::
               _M_emplace_unique<std::pair<std::__cxx11::string,google::protobuf::Descriptor_const*>>
                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::Descriptor_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor_const*>>>
                           *)&local_60,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.first._M_dataplus._M_p != &local_c8.first.field_2) {
        operator_delete(local_c8.first._M_dataplus._M_p,
                        local_c8.first.field_2._M_allocated_capacity + 1);
      }
      if ((((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         ((*(char *)(*(long *)(*(long *)(pVar10.first._M_node._M_node + 2) + 0x20) + 0x6b) != '\0'
          || (*(char *)(*(long *)(lVar1 + 0x20 + lVar8) + 0x6b) == '\x01')))) {
        psVar3 = *(string **)(local_70 + 8);
        std::operator+(&local_a0,"Expanded map entry type ",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (lVar8 + lVar1));
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_a0);
        paVar9 = &local_c8.first.field_2;
        psVar6 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_c8.first.field_2._M_allocated_capacity = *psVar6;
          local_c8.first.field_2._8_8_ = plVar4[3];
          local_c8.first._M_dataplus._M_p = (pointer)paVar9;
        }
        else {
          local_c8.first.field_2._M_allocated_capacity = *psVar6;
          local_c8.first._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_c8.first._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        AddError(local_78,psVar3,&local_80->super_Message,NAME,&local_c8.first);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8.first._M_dataplus._M_p != paVar9) {
          operator_delete(local_c8.first._M_dataplus._M_p,
                          local_c8.first.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
      }
      message = local_70;
      lVar1 = *(long *)(local_70 + 0x50);
      proto_00 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                           (local_68,(int)lVar7);
      DetectMapConflicts(local_78,(Descriptor *)(lVar1 + lVar8),proto_00);
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0xa8;
    } while (lVar7 < *(int *)(message + 0x48));
  }
  paVar9 = &local_c8.first.field_2;
  if (0 < *(int *)(message + 0x2c)) {
    lVar8 = 0;
    lVar7 = 0;
    do {
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
              ::find(&local_60,*(key_type **)(*(long *)(message + 0x30) + lVar8));
      if (((_Rb_tree_header *)iVar5._M_node != &local_60._M_impl.super__Rb_tree_header) &&
         (*(char *)((*(undefined8 **)(iVar5._M_node + 2))[4] + 0x6b) == '\x01')) {
        psVar3 = *(string **)(message + 8);
        std::operator+(&local_a0,"Expanded map entry type ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       **(undefined8 **)(iVar5._M_node + 2));
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_a0);
        psVar6 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_c8.first.field_2._M_allocated_capacity = *psVar6;
          local_c8.first.field_2._8_8_ = plVar4[3];
          local_c8.first._M_dataplus._M_p = (pointer)paVar9;
        }
        else {
          local_c8.first.field_2._M_allocated_capacity = *psVar6;
          local_c8.first._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_c8.first._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        AddError(local_78,psVar3,&local_80->super_Message,NAME,&local_c8.first);
        message = local_70;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8.first._M_dataplus._M_p != paVar9) {
          operator_delete(local_c8.first._M_dataplus._M_p,
                          local_c8.first.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
      }
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0xa8;
    } while (lVar7 < *(int *)(message + 0x2c));
  }
  if (0 < *(int *)(message + 0x58)) {
    lVar8 = 0;
    lVar7 = 0;
    do {
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
              ::find(&local_60,*(key_type **)(*(long *)(message + 0x60) + lVar8));
      if (((_Rb_tree_header *)iVar5._M_node != &local_60._M_impl.super__Rb_tree_header) &&
         (*(char *)((*(undefined8 **)(iVar5._M_node + 2))[4] + 0x6b) == '\x01')) {
        psVar3 = *(string **)(message + 8);
        std::operator+(&local_a0,"Expanded map entry type ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       **(undefined8 **)(iVar5._M_node + 2));
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_a0);
        psVar6 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_c8.first.field_2._M_allocated_capacity = *psVar6;
          local_c8.first.field_2._8_8_ = plVar4[3];
          local_c8.first._M_dataplus._M_p = (pointer)paVar9;
        }
        else {
          local_c8.first.field_2._M_allocated_capacity = *psVar6;
          local_c8.first._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_c8.first._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        AddError(local_78,psVar3,&local_80->super_Message,NAME,&local_c8.first);
        message = local_70;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8.first._M_dataplus._M_p != paVar9) {
          operator_delete(local_c8.first._M_dataplus._M_p,
                          local_c8.first.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
      }
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0x38;
    } while (lVar7 < *(int *)(message + 0x58));
  }
  if (0 < *(int *)(message + 0x38)) {
    lVar8 = 0;
    lVar7 = 0;
    do {
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
              ::find(&local_60,*(key_type **)(*(long *)(message + 0x40) + lVar8));
      if (((_Rb_tree_header *)iVar5._M_node != &local_60._M_impl.super__Rb_tree_header) &&
         (*(char *)((*(undefined8 **)(iVar5._M_node + 2))[4] + 0x6b) == '\x01')) {
        psVar3 = *(string **)(message + 8);
        std::operator+(&local_a0,"Expanded map entry type ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       **(undefined8 **)(iVar5._M_node + 2));
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_a0);
        psVar6 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_c8.first.field_2._M_allocated_capacity = *psVar6;
          local_c8.first.field_2._8_8_ = plVar4[3];
          local_c8.first._M_dataplus._M_p = (pointer)paVar9;
        }
        else {
          local_c8.first.field_2._M_allocated_capacity = *psVar6;
          local_c8.first._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_c8.first._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        AddError(local_78,psVar3,&local_80->super_Message,NAME,&local_c8.first);
        message = local_70;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8.first._M_dataplus._M_p != paVar9) {
          operator_delete(local_c8.first._M_dataplus._M_p,
                          local_c8.first.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
      }
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0x30;
    } while (lVar7 < *(int *)(message + 0x38));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void DescriptorBuilder::DetectMapConflicts(const Descriptor* message,
                                           const DescriptorProto& proto) {
  std::map<string, const Descriptor*> seen_types;
  for (int i = 0; i < message->nested_type_count(); ++i) {
    const Descriptor* nested = message->nested_type(i);
    std::pair<std::map<string, const Descriptor*>::iterator, bool> result =
        seen_types.insert(std::make_pair(nested->name(), nested));
    if (!result.second) {
      if (result.first->second->options().map_entry() ||
          nested->options().map_entry()) {
        AddError(message->full_name(), proto,
                 DescriptorPool::ErrorCollector::NAME,
                 "Expanded map entry type " + nested->name() +
                 " conflicts with an existing nested message type.");
      }
    }
    // Recursively test on the nested types.
    DetectMapConflicts(message->nested_type(i), proto.nested_type(i));
  }
  // Check for conflicted field names.
  for (int i = 0; i < message->field_count(); ++i) {
    const FieldDescriptor* field = message->field(i);
    std::map<string, const Descriptor*>::iterator iter =
        seen_types.find(field->name());
    if (iter != seen_types.end() && iter->second->options().map_entry()) {
      AddError(message->full_name(), proto,
               DescriptorPool::ErrorCollector::NAME,
               "Expanded map entry type " + iter->second->name() +
               " conflicts with an existing field.");
    }
  }
  // Check for conflicted enum names.
  for (int i = 0; i < message->enum_type_count(); ++i) {
    const EnumDescriptor* enum_desc = message->enum_type(i);
    std::map<string, const Descriptor*>::iterator iter =
        seen_types.find(enum_desc->name());
    if (iter != seen_types.end() && iter->second->options().map_entry()) {
      AddError(message->full_name(), proto,
               DescriptorPool::ErrorCollector::NAME,
               "Expanded map entry type " + iter->second->name() +
               " conflicts with an existing enum type.");
    }
  }
  // Check for conflicted oneof names.
  for (int i = 0; i < message->oneof_decl_count(); ++i) {
    const OneofDescriptor* oneof_desc = message->oneof_decl(i);
    std::map<string, const Descriptor*>::iterator iter =
        seen_types.find(oneof_desc->name());
    if (iter != seen_types.end() && iter->second->options().map_entry()) {
      AddError(message->full_name(), proto,
               DescriptorPool::ErrorCollector::NAME,
               "Expanded map entry type " + iter->second->name() +
               " conflicts with an existing oneof type.");
    }
  }
}